

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O3

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE
IoTHubClient_LL_UploadToBlob_CreateContext
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *azureBlobSasUri)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *uploadContext;
  SINGLYLINKEDLIST_HANDLE pSVar2;
  size_t sVar3;
  char *__src;
  char *blobStorageHostname;
  ulong uVar4;
  HTTPAPIEX_HANDLE pHVar5;
  int iVar6;
  size_t __size;
  char *pcVar7;
  size_t sVar8;
  
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0 || azureBlobSasUri == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
    }
    pcVar7 = "invalid argument detected handle=%p azureBlobSasUri=%p";
    iVar6 = 0x3a5;
    goto LAB_00128d63;
  }
  uploadContext = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)calloc(1,0x28);
  if (uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createUploadToBlobContextInstance",0x2c3,1,
                "Failed allocating IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT");
    }
  }
  else {
    pSVar2 = singlylinkedlist_create();
    uploadContext->blockIdList = pSVar2;
    if (pSVar2 != (SINGLYLINKEDLIST_HANDLE)0x0) {
      sVar3 = strlen(azureBlobSasUri);
      pcVar7 = strstr(azureBlobSasUri,"://");
      if (pcVar7 == (char *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          pcVar7 = "hostname cannot be determined";
          iVar6 = 0x2f3;
LAB_00128dfa:
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"parseAzureBlobSasUri",iVar6,1,pcVar7);
        }
LAB_00128e05:
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_00128e39;
        pcVar7 = "failed parsing Blob Storage SAS URI";
        iVar6 = 0x3b2;
      }
      else {
        pcVar7 = pcVar7 + 3;
        __src = strchr(pcVar7,0x2f);
        if (__src == (char *)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            pcVar7 = "relative path cannot be determined";
            iVar6 = 0x2fd;
            goto LAB_00128dfa;
          }
          goto LAB_00128e05;
        }
        sVar8 = (long)__src - (long)pcVar7;
        if (__src < pcVar7) {
          sVar8 = 0xffffffffffffffff;
        }
        __size = sVar8 + 1;
        if (__size == 0) {
          __size = 0xffffffffffffffff;
        }
        if ((__size == 0xffffffffffffffff) ||
           (blobStorageHostname = (char *)malloc(__size), blobStorageHostname == (char *)0x0)) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            pcVar7 = "failed to allocate memory for blob storage hostname, size:%zu";
            iVar6 = 0x307;
            goto LAB_00128dfa;
          }
          goto LAB_00128e05;
        }
        memcpy(blobStorageHostname,pcVar7,sVar8);
        blobStorageHostname[sVar8] = '\0';
        uVar4 = (long)__src - (long)azureBlobSasUri;
        if (__src < azureBlobSasUri) {
          uVar4 = 0xffffffffffffffff;
        }
        sVar8 = sVar3 - uVar4;
        if (sVar3 < uVar4) {
          sVar8 = 0xffffffffffffffff;
        }
        sVar3 = sVar8 + 1;
        if (sVar3 == 0) {
          sVar3 = 0xffffffffffffffff;
        }
        if ((sVar3 == 0xffffffffffffffff) || (pcVar7 = (char *)malloc(sVar3), pcVar7 == (char *)0x0)
           ) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"parseAzureBlobSasUri",0x314,1,
                      "failed to allocate memory for blob storage relative path, size:%zu",sVar3);
          }
          free(blobStorageHostname);
          goto LAB_00128e05;
        }
        memcpy(pcVar7,__src,sVar8);
        pcVar7[sVar8] = '\0';
        uploadContext->blobStorageHostname = blobStorageHostname;
        uploadContext->blobStorageRelativePath = pcVar7;
        uploadContext->u2bClientData = handle;
        pHVar5 = Blob_CreateHttpConnection
                           (blobStorageHostname,handle->certificates,&handle->http_proxy_options,
                            handle->networkInterface,handle->blob_upload_timeout_millisecs);
        uploadContext->blobHttpApiHandle = pHVar5;
        if (pHVar5 != (HTTPAPIEX_HANDLE)0x0) {
          return uploadContext;
        }
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_00128e39;
        pcVar7 = "Failed creating HTTP connection to Azure Blob";
        iVar6 = 0x3c3;
      }
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_CreateContext",iVar6,1,pcVar7);
LAB_00128e39:
      destroyUploadToBlobContextInstance(uploadContext);
      return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createUploadToBlobContextInstance",0x2cb,1,"Failed allocating list for blockIds");
    }
    free(uploadContext);
  }
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 == (LOGGER_LOG)0x0) {
    return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
  }
  pcVar7 = "Failed creating Upload to Blob context";
  iVar6 = 0x3aa;
LAB_00128d63:
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
            ,"IoTHubClient_LL_UploadToBlob_CreateContext",iVar6,1,pcVar7);
  return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE IoTHubClient_LL_UploadToBlob_CreateContext(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* azureBlobSasUri)
{
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT* result;

    if (handle == NULL || azureBlobSasUri == NULL)
    {
        LogError("invalid argument detected handle=%p azureBlobSasUri=%p", handle, azureBlobSasUri);
        result = NULL;
    }
    else if ((result = createUploadToBlobContextInstance()) == NULL)
    {
        LogError("Failed creating Upload to Blob context");
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (parseAzureBlobSasUri(azureBlobSasUri, &result->blobStorageHostname, &result->blobStorageRelativePath) != 0)
        {
            LogError("failed parsing Blob Storage SAS URI");
            destroyUploadToBlobContextInstance(result);
            result = NULL;
        }
        else
        {
            result->u2bClientData = upload_data;

            result->blobHttpApiHandle = Blob_CreateHttpConnection(
                result->blobStorageHostname,
                result->u2bClientData->certificates,
                &(result->u2bClientData->http_proxy_options),
                result->u2bClientData->networkInterface,
                result->u2bClientData->blob_upload_timeout_millisecs);

            if (result->blobHttpApiHandle == NULL)
            {
                LogError("Failed creating HTTP connection to Azure Blob");
                destroyUploadToBlobContextInstance(result);
                result = NULL;
            }
        }
    }

    return result;
}